

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void releasePageOne(MemPage *pPage)

{
  Pager *pPager;
  
  pPager = (Pager *)pPage->apOvfl[0];
  sqlite3PcacheRelease((PgHdr *)pPage);
  if (pPager->pPCache->nRefSum != 0) {
    return;
  }
  pagerUnlockAndRollback(pPager);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3PagerUnrefPageOne(DbPage *pPg){
  Pager *pPager;
  assert( pPg!=0 );
  assert( pPg->pgno==1 );
  assert( (pPg->flags & PGHDR_MMAP)==0 ); /* Page1 is never memory mapped */
  pPager = pPg->pPager;
  sqlite3PagerResetLockTimeout(pPager);
  sqlite3PcacheRelease(pPg);
  pagerUnlockIfUnused(pPager);
}